

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

string * __thiscall
testing::internal::StreamableToString<wchar_t*>
          (string *__return_storage_ptr__,internal *this,wchar_t **streamable)

{
  Message *this_00;
  Message local_20;
  internal *local_18;
  wchar_t **streamable_local;
  
  local_18 = this;
  streamable_local = (wchar_t **)__return_storage_ptr__;
  Message::Message(&local_20);
  this_00 = Message::operator<<(&local_20,*(wchar_t **)local_18);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,this_00);
  Message::~Message((Message *)0x2ef0c6);
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}